

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixie_provider.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::PixieProvider::OnDataDictionary
          (PixieProvider *this,DataDictionaryMessage *dict_message)

{
  IDataDictionary *pIVar1;
  logger *this_00;
  bool bVar2;
  IDataDictionary *pIVar3;
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  field_defs;
  string local_40;
  
  bVar2 = DataDictionaryMessage::IsUpdate(dict_message);
  this_00 = Log;
  if (bVar2) {
    DataDictionaryMessage::ToString_abi_cxx11_(&local_40,dict_message);
    spdlog::logger::log<std::__cxx11::string>
              (this_00,(source_loc)ZEXT816(0x1c3d25),info,
               "updated current dictionary with new fields: {}",&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    DataDictionaryMessage::GetFieldDefs
              ((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40,dict_message);
    DataDictionaryUtils::AddAllFields
              ((this->data_dictionary_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>.
               _M_head_impl,
               (vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40);
  }
  else {
    DataDictionaryMessage::ToString_abi_cxx11_(&local_40,dict_message);
    spdlog::logger::log<std::__cxx11::string>
              (this_00,(source_loc)ZEXT816(0x1c3d25),info,"replacing dictionary with: {}",&local_40)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    pIVar3 = (IDataDictionary *)operator_new(0x68);
    pIVar3->_vptr_IDataDictionary = (_func_int **)&PTR_FieldDefByFid_001e5d50;
    pIVar3[1]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[2]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[3]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[4]._vptr_IDataDictionary = (_func_int **)(pIVar3 + 2);
    pIVar3[5]._vptr_IDataDictionary = (_func_int **)(pIVar3 + 2);
    pIVar3[6]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[7]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[8]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[9]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar3[10]._vptr_IDataDictionary = (_func_int **)(pIVar3 + 8);
    pIVar3[0xb]._vptr_IDataDictionary = (_func_int **)(pIVar3 + 8);
    pIVar3[0xc]._vptr_IDataDictionary = (_func_int **)0x0;
    pIVar1 = (this->data_dictionary_)._M_t.
             super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
             .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>.
             _M_head_impl;
    (this->data_dictionary_)._M_t.
    super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
    ._M_t.
    super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
    .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>._M_head_impl =
         pIVar3;
    if (pIVar1 != (IDataDictionary *)0x0) {
      operator_delete(pIVar1,8);
    }
    DataDictionaryMessage::GetFieldDefs
              ((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40,dict_message);
    DataDictionaryUtils::AddAllFields
              ((this->data_dictionary_)._M_t.
               super___uniq_ptr_impl<bidfx_public_api::price::pixie::IDataDictionary,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_std::default_delete<bidfx_public_api::price::pixie::IDataDictionary>_>
               .super__Head_base<0UL,_bidfx_public_api::price::pixie::IDataDictionary_*,_false>.
               _M_head_impl,
               (vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
                *)&local_40);
  }
  std::
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  ::~vector((vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
             *)&local_40);
  return;
}

Assistant:

void PixieProvider::OnDataDictionary(DataDictionaryMessage& dict_message)
{
    if (dict_message.IsUpdate())
    {
        Log->info("updated current dictionary with new fields: {}", dict_message.ToString());
        auto field_defs = dict_message.GetFieldDefs();
        DataDictionaryUtils::AddAllFields(*data_dictionary_, field_defs);
    }
    else
    {
        Log->info("replacing dictionary with: {}", dict_message.ToString());
        data_dictionary_ = std::make_unique<ExtendableDataDictionary>();
        auto field_defs = dict_message.GetFieldDefs();
        DataDictionaryUtils::AddAllFields(*data_dictionary_, field_defs);
    }
}